

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmMakefileTargetGenerator::WriteObjectDependRules
          (cmMakefileTargetGenerator *this,cmSourceFile *source,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *depends)

{
  string *__x;
  char *pcVar1;
  allocator local_31;
  string local_30;
  
  __x = cmSourceFile::GetFullPath_abi_cxx11_(source);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(depends,__x);
  std::__cxx11::string::string((string *)&local_30,"OBJECT_DEPENDS",&local_31);
  pcVar1 = cmSourceFile::GetProperty(source,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  if (pcVar1 != (char *)0x0) {
    std::__cxx11::string::string((string *)&local_30,pcVar1,&local_31);
    cmSystemTools::ExpandListArgument(&local_30,depends,false);
    std::__cxx11::string::~string((string *)&local_30);
  }
  return;
}

Assistant:

void cmMakefileTargetGenerator::WriteObjectDependRules(
  cmSourceFile const& source, std::vector<std::string>& depends)
{
  // Create the list of dependencies known at cmake time.  These are
  // shared between the object file and dependency scanning rule.
  depends.push_back(source.GetFullPath());
  if (const char* objectDeps = source.GetProperty("OBJECT_DEPENDS")) {
    cmSystemTools::ExpandListArgument(objectDeps, depends);
  }
}